

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Vec_Int_t * Abc_NtkAssignStarts(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,int *pnTotal)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *vStarts;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  int *pnTotal_local;
  Vec_Ptr_t *vNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  vStarts._0_4_ = 0;
  iVar1 = Abc_NtkObjNum(pNtk);
  p = Vec_IntStart(iVar1);
  for (vStarts._4_4_ = 0; iVar1 = Vec_PtrSize(vNodes), vStarts._4_4_ < iVar1;
      vStarts._4_4_ = vStarts._4_4_ + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,vStarts._4_4_);
    Vec_IntWriteEntry(p,(pObj_00->field_6).iTemp,(int)vStarts);
    iVar1 = Abc_ObjFaninNum(pObj_00);
    iVar1 = Abc_Truth6WordNum(iVar1);
    vStarts._0_4_ = iVar1 + (int)vStarts;
  }
  *pnTotal = (int)vStarts;
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkAssignStarts( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, int * pnTotal )
{
    Abc_Obj_t * pObj; int i, Counter = 0;
    Vec_Int_t * vStarts = Vec_IntStart( Abc_NtkObjNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntWriteEntry( vStarts, pObj->iTemp, Counter );
        Counter += Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
    }
    *pnTotal = Counter;
    return vStarts;
}